

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssutil.cpp
# Opt level: O0

void qDrawRoundedCorners(QPainter *p,qreal x1,qreal y1,qreal x2,qreal y2,QSizeF *r1,QSizeF *r2,
                        Edge edge,BorderStyle s,QBrush *c)

{
  QColor color;
  bool bVar1;
  double dVar2;
  int in_ECX;
  QSizeF *in_RDX;
  QSizeF *in_RSI;
  int in_R8D;
  undefined8 in_R9;
  long in_FS_OFFSET;
  QPainter *in_XMM0_Qa;
  double dVar3;
  qreal qVar4;
  double dVar5;
  qreal qVar6;
  qreal qVar7;
  qreal qVar8;
  QPainter *this;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  qreal pwby2;
  int pwby2_1;
  BorderStyle s2;
  BorderStyle s1;
  qreal wby3;
  qreal pw;
  QPen pen;
  QBrush *in_stack_fffffffffffff8f8;
  int in_stack_fffffffffffff900;
  int alen;
  int in_stack_fffffffffffff904;
  int a;
  undefined4 in_stack_fffffffffffff908;
  undefined4 uVar9;
  PenCapStyle in_stack_fffffffffffff90c;
  undefined4 uVar10;
  QPen *in_stack_fffffffffffff910;
  QColor *in_stack_fffffffffffff918;
  QPainter *in_stack_fffffffffffff928;
  QPainter *in_stack_fffffffffffff978;
  QBrush *local_220;
  QRectF local_1a0;
  QRectF local_180;
  QRectF local_160;
  QRectF local_140;
  QRectF local_120;
  QRectF local_100;
  QRectF local_e0;
  QRectF local_c0;
  undefined1 *local_a0;
  QColor local_98;
  undefined8 local_18;
  undefined4 local_10;
  undefined2 uStack_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_ECX == 0) || (in_ECX == 2)) {
    local_220 = (QBrush *)(in_XMM3_Qa - in_XMM1_Qa);
  }
  else {
    local_220 = (QBrush *)(in_XMM2_Qa - (double)in_XMM0_Qa);
  }
  if (in_R8D == 5) {
    switch(in_ECX) {
    case 0:
    case 2:
      QBrush::QBrush((QBrush *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                     in_stack_fffffffffffff8f8);
      qDrawRoundedCorners(in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa,(qreal)in_RSI,in_RDX,
                          (QSizeF *)CONCAT44(in_ECX,in_R8D),(Edge)((ulong)in_R9 >> 0x20),
                          (BorderStyle)in_R9,local_220);
      QBrush::~QBrush((QBrush *)0xa235fa);
      QBrush::QBrush((QBrush *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                     in_stack_fffffffffffff8f8);
      qDrawRoundedCorners(in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa,(qreal)in_RSI,in_RDX,
                          (QSizeF *)CONCAT44(in_ECX,in_R8D),(Edge)((ulong)in_R9 >> 0x20),
                          (BorderStyle)in_R9,local_220);
      QBrush::~QBrush((QBrush *)0xa23701);
      break;
    case 1:
      QBrush::QBrush((QBrush *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                     in_stack_fffffffffffff8f8);
      qDrawRoundedCorners(in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa,(qreal)in_RSI,in_RDX,
                          (QSizeF *)CONCAT44(in_ECX,in_R8D),(Edge)((ulong)in_R9 >> 0x20),
                          (BorderStyle)in_R9,local_220);
      QBrush::~QBrush((QBrush *)0xa23a08);
      QBrush::QBrush((QBrush *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                     in_stack_fffffffffffff8f8);
      qDrawRoundedCorners(in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa,(qreal)in_RSI,in_RDX,
                          (QSizeF *)CONCAT44(in_ECX,in_R8D),(Edge)((ulong)in_R9 >> 0x20),
                          (BorderStyle)in_R9,local_220);
      QBrush::~QBrush((QBrush *)0xa23b07);
      break;
    case 3:
      QBrush::QBrush((QBrush *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                     in_stack_fffffffffffff8f8);
      qDrawRoundedCorners(in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa,(qreal)in_RSI,in_RDX,
                          (QSizeF *)CONCAT44(in_ECX,in_R8D),(Edge)((ulong)in_R9 >> 0x20),
                          (BorderStyle)in_R9,local_220);
      QBrush::~QBrush((QBrush *)0xa23805);
      QBrush::QBrush((QBrush *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                     in_stack_fffffffffffff8f8);
      qDrawRoundedCorners(in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa,(qreal)in_RSI,in_RDX,
                          (QSizeF *)CONCAT44(in_ECX,in_R8D),(Edge)((ulong)in_R9 >> 0x20),
                          (BorderStyle)in_R9,local_220);
      QBrush::~QBrush((QBrush *)0xa23904);
    }
  }
  else {
    if ((in_R8D == 9) || (in_R8D == 8)) {
      qRound(5.2529454718358e-317);
      switch(in_ECX) {
      case 0:
        QBrush::QBrush((QBrush *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                       in_stack_fffffffffffff8f8);
        qDrawRoundedCorners(in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa,(qreal)in_RSI,in_RDX,
                            (QSizeF *)CONCAT44(in_ECX,in_R8D),(Edge)((ulong)in_R9 >> 0x20),
                            (BorderStyle)in_R9,local_220);
        QBrush::~QBrush((QBrush *)0xa23cd1);
        QBrush::QBrush((QBrush *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                       in_stack_fffffffffffff8f8);
        qDrawRoundedCorners(in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa,(qreal)in_RSI,in_RDX,
                            (QSizeF *)CONCAT44(in_ECX,in_R8D),(Edge)((ulong)in_R9 >> 0x20),
                            (BorderStyle)in_R9,local_220);
        QBrush::~QBrush((QBrush *)0xa23dd9);
        break;
      case 1:
        QBrush::QBrush((QBrush *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                       in_stack_fffffffffffff8f8);
        qDrawRoundedCorners(in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa,(qreal)in_RSI,in_RDX,
                            (QSizeF *)CONCAT44(in_ECX,in_R8D),(Edge)((ulong)in_R9 >> 0x20),
                            (BorderStyle)in_R9,local_220);
        QBrush::~QBrush((QBrush *)0xa2431f);
        QBrush::QBrush((QBrush *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                       in_stack_fffffffffffff8f8);
        qDrawRoundedCorners(in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa,(qreal)in_RSI,in_RDX,
                            (QSizeF *)CONCAT44(in_ECX,in_R8D),(Edge)((ulong)in_R9 >> 0x20),
                            (BorderStyle)in_R9,local_220);
        QBrush::~QBrush((QBrush *)0xa2442a);
        break;
      case 2:
        QBrush::QBrush((QBrush *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                       in_stack_fffffffffffff8f8);
        qDrawRoundedCorners(in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa,(qreal)in_RSI,in_RDX,
                            (QSizeF *)CONCAT44(in_ECX,in_R8D),(Edge)((ulong)in_R9 >> 0x20),
                            (BorderStyle)in_R9,local_220);
        QBrush::~QBrush((QBrush *)0xa23ee9);
        QBrush::QBrush((QBrush *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                       in_stack_fffffffffffff8f8);
        qDrawRoundedCorners(in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa,(qreal)in_RSI,in_RDX,
                            (QSizeF *)CONCAT44(in_ECX,in_R8D),(Edge)((ulong)in_R9 >> 0x20),
                            (BorderStyle)in_R9,local_220);
        QBrush::~QBrush((QBrush *)0xa23ff4);
        break;
      case 3:
        QBrush::QBrush((QBrush *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                       in_stack_fffffffffffff8f8);
        qDrawRoundedCorners(in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa,(qreal)in_RSI,in_RDX,
                            (QSizeF *)CONCAT44(in_ECX,in_R8D),(Edge)((ulong)in_R9 >> 0x20),
                            (BorderStyle)in_R9,local_220);
        QBrush::~QBrush((QBrush *)0xa24104);
        QBrush::QBrush((QBrush *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                       in_stack_fffffffffffff8f8);
        qDrawRoundedCorners(in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa,(qreal)in_RSI,in_RDX,
                            (QSizeF *)CONCAT44(in_ECX,in_R8D),(Edge)((ulong)in_R9 >> 0x20),
                            (BorderStyle)in_R9,local_220);
        QBrush::~QBrush((QBrush *)0xa2420f);
      }
    }
    else if (((in_R8D == 0xb) && ((in_ECX == 0 || (in_ECX == 3)))) ||
            ((in_R8D == 10 && ((in_ECX == 2 || (in_ECX == 1)))))) {
      QBrush::color((QBrush *)0xa24480);
      local_98 = QColor::lighter(in_stack_fffffffffffff918,
                                 (int)((ulong)in_stack_fffffffffffff910 >> 0x20));
      local_18 = local_98._0_8_;
      local_10 = local_98.ct._4_4_;
      uStack_c = local_98.ct._8_2_;
      color.ct._0_4_ = in_stack_fffffffffffff904;
      color.cspec = in_stack_fffffffffffff900;
      color.ct._4_4_ = in_stack_fffffffffffff908;
      color._12_4_ = in_stack_fffffffffffff90c;
      QBrush::operator=(in_stack_fffffffffffff8f8,color);
    }
    QPainter::save(in_stack_fffffffffffff928);
    dVar3 = (double)local_220 * 0.5;
    QPainter::setBrush((QPainter *)in_stack_fffffffffffff8f8,
                       (BrushStyle)((ulong)in_stack_fffffffffffff928 >> 0x20));
    local_a0 = &DAT_aaaaaaaaaaaaaaaa;
    qPenFromStyle((QBrush *)in_stack_fffffffffffff918,(qreal)in_stack_fffffffffffff910,
                  in_stack_fffffffffffff90c);
    QPen::setCapStyle(in_stack_fffffffffffff910,in_stack_fffffffffffff90c);
    QPainter::setPen((QPainter *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                     (QPen *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
    switch(in_ECX) {
    case 0:
      bVar1 = QSizeF::isEmpty(in_RSI);
      if (!bVar1) {
        qVar6 = QSizeF::width(in_RSI);
        dVar5 = in_XMM1_Qa + dVar3;
        qVar7 = QSizeF::width(in_RSI);
        dVar2 = -(double)local_220;
        qVar8 = QSizeF::height(in_RSI);
        QRectF::QRectF(&local_c0,((double)in_XMM0_Qa - qVar6) + dVar3,dVar5,qVar7 + qVar7 + dVar2,
                       qVar8 + qVar8 + -(double)local_220);
        QPainter::drawArc((QPainter *)in_stack_fffffffffffff910,
                          (QRectF *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                          in_stack_fffffffffffff904,in_stack_fffffffffffff900);
      }
      bVar1 = QSizeF::isEmpty(in_RDX);
      if (!bVar1) {
        qVar6 = QSizeF::width(in_RDX);
        qVar7 = QSizeF::width(in_RDX);
        dVar2 = -(double)local_220;
        qVar8 = QSizeF::height(in_RDX);
        QRectF::QRectF(&local_e0,(in_XMM2_Qa - qVar6) + dVar3,in_XMM1_Qa + dVar3,
                       qVar7 + qVar7 + dVar2,qVar8 + qVar8 + -(double)local_220);
        QPainter::drawArc((QPainter *)in_stack_fffffffffffff910,
                          (QRectF *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                          in_stack_fffffffffffff904,in_stack_fffffffffffff900);
      }
      break;
    case 1:
      bVar1 = QSizeF::isEmpty(in_RSI);
      dVar2 = in_XMM2_Qa;
      if (!bVar1) {
        qVar6 = QSizeF::width(in_RSI);
        qVar7 = QSizeF::height(in_RSI);
        qVar8 = QSizeF::width(in_RSI);
        dVar5 = -(double)local_220;
        qVar4 = QSizeF::height(in_RSI);
        QRectF::QRectF(&local_180,(in_XMM2_Qa - (qVar6 + qVar6)) + dVar3,
                       (in_XMM1_Qa - qVar7) + dVar3,qVar8 + qVar8 + dVar5,
                       qVar4 + qVar4 + -(double)local_220);
        QPainter::drawArc((QPainter *)in_stack_fffffffffffff910,
                          (QRectF *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                          in_stack_fffffffffffff904,in_stack_fffffffffffff900);
      }
      bVar1 = QSizeF::isEmpty(in_RDX);
      if (!bVar1) {
        alen = SUB84(dVar2,0);
        a = (int)((ulong)dVar2 >> 0x20);
        qVar6 = QSizeF::width(in_RDX);
        dVar2 = (double)CONCAT44(a,alen);
        uVar9 = SUB84(in_XMM3_Qa,0);
        uVar10 = (undefined4)((ulong)in_XMM3_Qa >> 0x20);
        qVar7 = QSizeF::height(in_RDX);
        this = (QPainter *)(((double)CONCAT44(uVar10,uVar9) - qVar7) + dVar3);
        qVar7 = QSizeF::width(in_RDX);
        dVar5 = qVar7 + qVar7 + -(double)local_220;
        qVar7 = QSizeF::height(in_RDX);
        QRectF::QRectF(&local_1a0,(dVar2 - (qVar6 + qVar6)) + dVar3,(qreal)this,dVar5,
                       qVar7 + qVar7 + -(double)local_220);
        QPainter::drawArc(this,(QRectF *)CONCAT44(uVar10,uVar9),a,alen);
      }
      break;
    case 2:
      bVar1 = QSizeF::isEmpty(in_RSI);
      dVar2 = in_XMM3_Qa;
      if (!bVar1) {
        qVar6 = QSizeF::width(in_RSI);
        dVar2 = in_XMM3_Qa;
        qVar7 = QSizeF::height(in_RSI);
        qVar8 = QSizeF::width(in_RSI);
        dVar5 = -(double)local_220;
        qVar4 = QSizeF::height(in_RSI);
        QRectF::QRectF(&local_100,((double)in_XMM0_Qa - qVar6) + dVar3,
                       (in_XMM3_Qa - (qVar7 + qVar7)) + dVar3,qVar8 + qVar8 + dVar5,
                       qVar4 + qVar4 + -(double)local_220);
        QPainter::drawArc((QPainter *)in_stack_fffffffffffff910,
                          (QRectF *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                          in_stack_fffffffffffff904,in_stack_fffffffffffff900);
      }
      bVar1 = QSizeF::isEmpty(in_RDX);
      if (!bVar1) {
        qVar6 = QSizeF::width(in_RDX);
        qVar7 = QSizeF::height(in_RDX);
        qVar8 = QSizeF::width(in_RDX);
        dVar5 = -(double)local_220;
        qVar4 = QSizeF::height(in_RDX);
        QRectF::QRectF(&local_120,(in_XMM2_Qa - qVar6) + dVar3,(dVar2 - (qVar7 + qVar7)) + dVar3,
                       qVar8 + qVar8 + dVar5,qVar4 + qVar4 + -(double)local_220);
        QPainter::drawArc((QPainter *)in_stack_fffffffffffff910,
                          (QRectF *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                          in_stack_fffffffffffff904,in_stack_fffffffffffff900);
      }
      break;
    case 3:
      bVar1 = QSizeF::isEmpty(in_RSI);
      if (!bVar1) {
        dVar5 = (double)in_XMM0_Qa + dVar3;
        qVar6 = QSizeF::height(in_RSI);
        qVar7 = QSizeF::width(in_RSI);
        dVar2 = -(double)local_220;
        qVar8 = QSizeF::height(in_RSI);
        QRectF::QRectF(&local_140,dVar5,(in_XMM1_Qa - qVar6) + dVar3,qVar7 + qVar7 + dVar2,
                       qVar8 + qVar8 + -(double)local_220);
        QPainter::drawArc((QPainter *)in_stack_fffffffffffff910,
                          (QRectF *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                          in_stack_fffffffffffff904,in_stack_fffffffffffff900);
      }
      bVar1 = QSizeF::isEmpty(in_RDX);
      if (!bVar1) {
        in_stack_fffffffffffff978 = (QPainter *)((double)in_XMM0_Qa + dVar3);
        qVar6 = QSizeF::height(in_RDX);
        qVar7 = QSizeF::width(in_RDX);
        dVar2 = -(double)local_220;
        qVar8 = QSizeF::height(in_RDX);
        QRectF::QRectF(&local_160,(qreal)in_stack_fffffffffffff978,(in_XMM3_Qa - qVar6) + dVar3,
                       qVar7 + qVar7 + dVar2,qVar8 + qVar8 + -(double)local_220);
        QPainter::drawArc((QPainter *)in_stack_fffffffffffff910,
                          (QRectF *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                          in_stack_fffffffffffff904,in_stack_fffffffffffff900);
      }
    }
    QPainter::restore(in_stack_fffffffffffff978);
    QPen::~QPen((QPen *)0xa25026);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void qDrawRoundedCorners(QPainter *p, qreal x1, qreal y1, qreal x2, qreal y2,
                         const QSizeF& r1, const QSizeF& r2,
                         Edge edge, BorderStyle s, QBrush c)
{
    const qreal pw = (edge == TopEdge || edge == BottomEdge) ? y2-y1 : x2-x1;
    if (s == BorderStyle_Double) {
        qreal wby3 = pw/3;
        switch (edge) {
        case TopEdge:
        case BottomEdge:
            qDrawRoundedCorners(p, x1, y1, x2, y1+wby3, r1, r2, edge, BorderStyle_Solid, c);
            qDrawRoundedCorners(p, x1, y2-wby3, x2, y2, r1, r2, edge, BorderStyle_Solid, c);
            break;
        case LeftEdge:
            qDrawRoundedCorners(p, x1, y1+1, x1+wby3, y2, r1, r2, LeftEdge, BorderStyle_Solid, c);
            qDrawRoundedCorners(p, x2-wby3, y1+1, x2, y2, r1, r2, LeftEdge, BorderStyle_Solid, c);
            break;
        case RightEdge:
            qDrawRoundedCorners(p, x1, y1+1, x1+wby3, y2, r1, r2, RightEdge, BorderStyle_Solid, c);
            qDrawRoundedCorners(p, x2-wby3, y1+1, x2, y2, r1, r2, RightEdge, BorderStyle_Solid, c);
            break;
        default:
            break;
        }
        return;
    } else if (s == BorderStyle_Ridge || s == BorderStyle_Groove) {
        BorderStyle s1, s2;
        if (s == BorderStyle_Groove) {
            s1 = BorderStyle_Inset;
            s2 = BorderStyle_Outset;
        } else {
            s1 = BorderStyle_Outset;
            s2 = BorderStyle_Inset;
        }
        int pwby2 = qRound(pw/2);
        switch (edge) {
        case TopEdge:
            qDrawRoundedCorners(p, x1, y1, x2, y1 + pwby2, r1, r2, TopEdge, s1, c);
            qDrawRoundedCorners(p, x1, y1 + pwby2, x2, y2, r1, r2, TopEdge, s2, c);
            break;
        case BottomEdge:
            qDrawRoundedCorners(p, x1, y1 + pwby2, x2, y2, r1, r2, BottomEdge, s1, c);
            qDrawRoundedCorners(p, x1, y1, x2, y2-pwby2, r1, r2, BottomEdge, s2, c);
            break;
        case LeftEdge:
            qDrawRoundedCorners(p, x1, y1, x1 + pwby2, y2, r1, r2, LeftEdge, s1, c);
            qDrawRoundedCorners(p, x1 + pwby2, y1, x2, y2, r1, r2, LeftEdge, s2, c);
            break;
        case RightEdge:
            qDrawRoundedCorners(p, x1 + pwby2, y1, x2, y2, r1, r2, RightEdge, s1, c);
            qDrawRoundedCorners(p, x1, y1, x2 - pwby2, y2, r1, r2, RightEdge, s2, c);
            break;
        default:
            break;
        }
    } else if ((s == BorderStyle_Outset && (edge == TopEdge || edge == LeftEdge))
            || (s == BorderStyle_Inset && (edge == BottomEdge || edge == RightEdge)))
            c = c.color().lighter();

    p->save();
    qreal pwby2 = pw/2;
    p->setBrush(Qt::NoBrush);
    QPen pen = qPenFromStyle(c, pw, s);
    pen.setCapStyle(Qt::SquareCap); // this eliminates the offby1 errors that we might hit below
    p->setPen(pen);
    switch (edge) {
    case TopEdge:
        if (!r1.isEmpty())
            p->drawArc(QRectF(x1 - r1.width() + pwby2, y1 + pwby2,
                              2*r1.width() - pw, 2*r1.height() - pw), 135*16, -45*16);
        if (!r2.isEmpty())
            p->drawArc(QRectF(x2 - r2.width() + pwby2, y1 + pwby2,
                       2*r2.width() - pw, 2*r2.height() - pw), 45*16, 45*16);
        break;
    case BottomEdge:
        if (!r1.isEmpty())
            p->drawArc(QRectF(x1 - r1.width() + pwby2, y2 - 2*r1.height() + pwby2,
                              2*r1.width() - pw, 2*r1.height() - pw), -90 * 16, -45 * 16);
        if (!r2.isEmpty())
            p->drawArc(QRectF(x2 - r2.width() + pwby2, y2 - 2*r2.height() + pwby2,
                       2*r2.width() - pw, 2*r2.height() - pw), -90 * 16, 45 * 16);
        break;
    case LeftEdge:
        if (!r1.isEmpty())
            p->drawArc(QRectF(x1 + pwby2, y1 - r1.height() + pwby2,
                       2*r1.width() - pw, 2*r1.height() - pw), 135*16, 45*16);
        if (!r2.isEmpty())
            p->drawArc(QRectF(x1 + pwby2, y2 - r2.height() + pwby2,
                       2*r2.width() - pw, 2*r2.height() - pw), 180*16, 45*16);
        break;
    case RightEdge:
        if (!r1.isEmpty())
            p->drawArc(QRectF(x2 - 2*r1.width() + pwby2, y1 - r1.height() + pwby2,
                       2*r1.width() - pw, 2*r1.height() - pw), 45*16, -45*16);
        if (!r2.isEmpty())
            p->drawArc(QRectF(x2 - 2*r2.width() + pwby2, y2 - r2.height() + pwby2,
                       2*r2.width() - pw, 2*r2.height() - pw), 315*16, 45*16);
        break;
    default:
        break;
    }
    p->restore();
}